

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_SaveLineSpecial(line_t_conflict *ld)

{
  ulong uVar1;
  
  if (ld->sidedef[0] != (side_t *)0x0) {
    uVar1 = ((long)ld->sidedef[0] - (long)sides) / 0xc0;
    if ((ld->special != 0xbe) || (ld->args[1] == 1)) {
      uVar1 = uVar1 & 0xffffffff;
      sidetemp[uVar1].field_0.a.special = (short)ld->special;
      sidetemp[uVar1].field_0.a.tag = (short)ld->args[0];
      return;
    }
    sidetemp[uVar1 & 0xffffffff].field_0.a.special = 0;
  }
  return;
}

Assistant:

void P_SaveLineSpecial (line_t *ld)
{
	if (ld->sidedef[0] == NULL)
		return;

	DWORD sidenum = DWORD(ld->sidedef[0]-sides);
	// killough 4/4/98: support special sidedef interpretation below
	// [RH] Save Static_Init only if it's interested in the textures
	if	(ld->special != Static_Init || ld->args[1] == Init_Color)
	{
		sidetemp[sidenum].a.special = ld->special;
		sidetemp[sidenum].a.tag = ld->args[0];
	}
	else
	{
		sidetemp[sidenum].a.special = 0;
	}
}